

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O1

void __thiscall QPlainTextEdit::changeEvent(QPlainTextEdit *this,QEvent *e)

{
  short sVar1;
  QPlainTextEditPrivate *this_00;
  QScrollBar *this_01;
  QPlainTextEditControl *pQVar2;
  bool bVar3;
  LayoutDirection LVar4;
  int iVar5;
  int iVar6;
  QTextDocument *pQVar7;
  QPalette *pQVar8;
  long in_FS_OFFSET;
  qreal qVar9;
  QPointF local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QPlainTextEditPrivate **)
             &(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  QFrame::changeEvent((QFrame *)this,e);
  sVar1 = *(short *)(e + 8);
  switch(sVar1) {
  case 0x5b:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x5f:
  case 0x60:
    break;
  case 0x61:
switchD_004a376a_caseD_61:
    pQVar7 = QWidgetTextControl::document((QWidgetTextControl *)this_00->control);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      QTextDocument::setDefaultFont((QFont *)pQVar7);
      return;
    }
    goto LAB_004a390d;
  case 0x62:
    (**(code **)(*(long *)e + 0x10))
              (e,(((this->super_QAbstractScrollArea).super_QFrame.super_QWidget.data)->
                  widget_attributes & 1) == 0);
    pQVar2 = this_00->control;
    pQVar8 = QWidget::palette((QWidget *)this);
    QWidgetTextControl::setPalette((QWidgetTextControl *)pQVar2,pQVar8);
  case 0x5a:
    pQVar2 = this_00->control;
    LVar4 = QWidget::layoutDirection
                      (*(QWidget **)
                        &(this_00->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                         super_QWidgetPrivate.field_0x8);
    this_01 = (this_00->super_QAbstractScrollAreaPrivate).hbar;
    if (LVar4 == RightToLeft) {
      iVar5 = QAbstractSlider::maximum(&this_01->super_QAbstractSlider);
      iVar6 = QAbstractSlider::value
                        (&((this_00->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider)
      ;
      iVar5 = iVar5 - iVar6;
    }
    else {
      iVar5 = QAbstractSlider::value(&this_01->super_QAbstractSlider);
    }
    qVar9 = QPlainTextEditPrivate::verticalOffset
                      (this_00,this_00->control->topBlock,this_00->topLine);
    local_40.yp = qVar9 + this_00->topLineFracture;
    local_40.xp = (double)iVar5;
    QWidgetTextControl::processEvent
              ((QWidgetTextControl *)pQVar2,e,&local_40,
               (this_00->super_QAbstractScrollAreaPrivate).viewport);
    break;
  case 99:
    bVar3 = QWidget::isActiveWindow((QWidget *)this);
    if (!bVar3) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        QBasicTimer::stop();
        return;
      }
      goto LAB_004a390d;
    }
    break;
  default:
    if (sVar1 == 0x27) {
      pQVar2 = this_00->control;
      pQVar8 = QWidget::palette((QWidget *)this);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        QWidgetTextControl::setPalette((QWidgetTextControl *)pQVar2,pQVar8);
        return;
      }
      goto LAB_004a390d;
    }
    if (sVar1 == 0x24) goto switchD_004a376a_caseD_61;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
LAB_004a390d:
  __stack_chk_fail();
}

Assistant:

void QPlainTextEdit::changeEvent(QEvent *e)
{
    Q_D(QPlainTextEdit);
    QAbstractScrollArea::changeEvent(e);

    switch (e->type()) {
    case QEvent::ApplicationFontChange:
    case QEvent::FontChange:
        d->control->document()->setDefaultFont(font());
        break;
    case QEvent::ActivationChange:
        if (!isActiveWindow())
            d->autoScrollTimer.stop();
        break;
    case QEvent::EnabledChange:
        e->setAccepted(isEnabled());
        d->control->setPalette(palette());
        d->sendControlEvent(e);
        break;
    case QEvent::PaletteChange:
        d->control->setPalette(palette());
        break;
    case QEvent::LayoutDirectionChange:
        d->sendControlEvent(e);
        break;
    default:
        break;
    }
}